

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

UnaryFunctionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_unary(NeuralNetworkLayer *this)

{
  UnaryFunctionLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0xdc) {
    clear_layer(this);
    this->_oneof_case_[0] = 0xdc;
    this_00 = (UnaryFunctionLayerParams *)operator_new(0x28);
    UnaryFunctionLayerParams::UnaryFunctionLayerParams(this_00);
    (this->layer_).unary_ = this_00;
  }
  return (UnaryFunctionLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::UnaryFunctionLayerParams* NeuralNetworkLayer::mutable_unary() {
  if (!has_unary()) {
    clear_layer();
    set_has_unary();
    layer_.unary_ = new ::CoreML::Specification::UnaryFunctionLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.unary)
  return layer_.unary_;
}